

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::UpdateTextureID(ImDrawList *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  ImVec4 *local_58;
  value_type *local_48;
  value_type *local_40;
  ImTextureID local_38;
  ImDrawCmd *prev_cmd;
  ImDrawCmd *curr_cmd;
  ImTextureID curr_texture_id;
  ImDrawList *this_local;
  
  if ((this->_TextureIdStack).Size == 0) {
    local_38 = (ImTextureID)0x0;
  }
  else {
    local_38 = (this->_TextureIdStack).Data[(this->_TextureIdStack).Size + -1];
  }
  if ((this->CmdBuffer).Size == 0) {
    local_40 = (value_type *)0x0;
  }
  else {
    local_40 = ImVector<ImDrawCmd>::back(&this->CmdBuffer);
  }
  if ((local_40 == (value_type *)0x0) ||
     (((local_40->ElemCount != 0 && (local_40->TextureId != local_38)) ||
      (local_40->UserCallback != (ImDrawCallback)0x0)))) {
    AddDrawCmd(this);
  }
  else {
    if ((this->CmdBuffer).Size < 2) {
      local_48 = (value_type *)0x0;
    }
    else {
      local_48 = local_40 + -1;
    }
    if ((local_48 != (value_type *)0x0) && (local_48->TextureId == local_38)) {
      if ((this->_ClipRectStack).Size == 0) {
        local_58 = &GNullClipRect;
      }
      else {
        local_58 = (this->_ClipRectStack).Data + ((this->_ClipRectStack).Size + -1);
      }
      cVar7 = -(*(char *)&(local_48->ClipRect).x == *(char *)&local_58->x);
      cVar8 = -(*(char *)((long)&(local_48->ClipRect).x + 1) == *(char *)((long)&local_58->x + 1));
      cVar9 = -(*(char *)((long)&(local_48->ClipRect).x + 2) == *(char *)((long)&local_58->x + 2));
      cVar10 = -(*(char *)((long)&(local_48->ClipRect).x + 3) == *(char *)((long)&local_58->x + 3));
      cVar11 = -(*(char *)&(local_48->ClipRect).y == *(char *)&local_58->y);
      cVar12 = -(*(char *)((long)&(local_48->ClipRect).y + 1) == *(char *)((long)&local_58->y + 1));
      cVar13 = -(*(char *)((long)&(local_48->ClipRect).y + 2) == *(char *)((long)&local_58->y + 2));
      cVar14 = -(*(char *)((long)&(local_48->ClipRect).y + 3) == *(char *)((long)&local_58->y + 3));
      cVar15 = -(*(char *)&(local_48->ClipRect).z == *(char *)&local_58->z);
      cVar16 = -(*(char *)((long)&(local_48->ClipRect).z + 1) == *(char *)((long)&local_58->z + 1));
      cVar17 = -(*(char *)((long)&(local_48->ClipRect).z + 2) == *(char *)((long)&local_58->z + 2));
      cVar18 = -(*(char *)((long)&(local_48->ClipRect).z + 3) == *(char *)((long)&local_58->z + 3));
      cVar19 = -(*(char *)&(local_48->ClipRect).w == *(char *)&local_58->w);
      cVar20 = -(*(char *)((long)&(local_48->ClipRect).w + 1) == *(char *)((long)&local_58->w + 1));
      cVar21 = -(*(char *)((long)&(local_48->ClipRect).w + 2) == *(char *)((long)&local_58->w + 2));
      bVar22 = -(*(char *)((long)&(local_48->ClipRect).w + 3) == *(char *)((long)&local_58->w + 3));
      auVar1[1] = cVar8;
      auVar1[0] = cVar7;
      auVar1[2] = cVar9;
      auVar1[3] = cVar10;
      auVar1[4] = cVar11;
      auVar1[5] = cVar12;
      auVar1[6] = cVar13;
      auVar1[7] = cVar14;
      auVar1[8] = cVar15;
      auVar1[9] = cVar16;
      auVar1[10] = cVar17;
      auVar1[0xb] = cVar18;
      auVar1[0xc] = cVar19;
      auVar1[0xd] = cVar20;
      auVar1[0xe] = cVar21;
      auVar1[0xf] = bVar22;
      auVar2[1] = cVar8;
      auVar2[0] = cVar7;
      auVar2[2] = cVar9;
      auVar2[3] = cVar10;
      auVar2[4] = cVar11;
      auVar2[5] = cVar12;
      auVar2[6] = cVar13;
      auVar2[7] = cVar14;
      auVar2[8] = cVar15;
      auVar2[9] = cVar16;
      auVar2[10] = cVar17;
      auVar2[0xb] = cVar18;
      auVar2[0xc] = cVar19;
      auVar2[0xd] = cVar20;
      auVar2[0xe] = cVar21;
      auVar2[0xf] = bVar22;
      auVar6[1] = cVar10;
      auVar6[0] = cVar9;
      auVar6[2] = cVar11;
      auVar6[3] = cVar12;
      auVar6[4] = cVar13;
      auVar6[5] = cVar14;
      auVar6[6] = cVar15;
      auVar6[7] = cVar16;
      auVar6[8] = cVar17;
      auVar6[9] = cVar18;
      auVar6[10] = cVar19;
      auVar6[0xb] = cVar20;
      auVar6[0xc] = cVar21;
      auVar6[0xd] = bVar22;
      auVar5[1] = cVar11;
      auVar5[0] = cVar10;
      auVar5[2] = cVar12;
      auVar5[3] = cVar13;
      auVar5[4] = cVar14;
      auVar5[5] = cVar15;
      auVar5[6] = cVar16;
      auVar5[7] = cVar17;
      auVar5[8] = cVar18;
      auVar5[9] = cVar19;
      auVar5[10] = cVar20;
      auVar5[0xb] = cVar21;
      auVar5[0xc] = bVar22;
      auVar4[1] = cVar12;
      auVar4[0] = cVar11;
      auVar4[2] = cVar13;
      auVar4[3] = cVar14;
      auVar4[4] = cVar15;
      auVar4[5] = cVar16;
      auVar4[6] = cVar17;
      auVar4[7] = cVar18;
      auVar4[8] = cVar19;
      auVar4[9] = cVar20;
      auVar4[10] = cVar21;
      auVar4[0xb] = bVar22;
      auVar3[1] = cVar13;
      auVar3[0] = cVar12;
      auVar3[2] = cVar14;
      auVar3[3] = cVar15;
      auVar3[4] = cVar16;
      auVar3[5] = cVar17;
      auVar3[6] = cVar18;
      auVar3[7] = cVar19;
      auVar3[8] = cVar20;
      auVar3[9] = cVar21;
      auVar3[10] = bVar22;
      if (((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                    (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                    (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                    (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                    (ushort)((byte)(CONCAT19(bVar22,CONCAT18(cVar21,CONCAT17(cVar20,CONCAT16(cVar19,
                                                  CONCAT15(cVar18,CONCAT14(cVar17,CONCAT13(cVar16,
                                                  CONCAT12(cVar15,CONCAT11(cVar14,cVar13))))))))) >>
                                   7) & 1) << 6 |
                    (ushort)((byte)(CONCAT18(bVar22,CONCAT17(cVar21,CONCAT16(cVar20,CONCAT15(cVar19,
                                                  CONCAT14(cVar18,CONCAT13(cVar17,CONCAT12(cVar16,
                                                  CONCAT11(cVar15,cVar14)))))))) >> 7) & 1) << 7 |
                   (ushort)(bVar22 >> 7) << 0xf) == 0xffff) &&
         (local_48->UserCallback == (ImDrawCallback)0x0)) {
        ImVector<ImDrawCmd>::pop_back(&this->CmdBuffer);
        return;
      }
    }
    local_40->TextureId = local_38;
  }
  return;
}

Assistant:

void ImDrawList::UpdateTextureID()
{
    // If current command is used with different settings we need to add a new command
    const ImTextureID curr_texture_id = GetCurrentTextureId();
    ImDrawCmd* curr_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != curr_texture_id) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (prev_cmd && prev_cmd->TextureId == curr_texture_id && memcmp(&prev_cmd->ClipRect, &GetCurrentClipRect(), sizeof(ImVec4)) == 0 && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->TextureId = curr_texture_id;
}